

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.cpp
# Opt level: O0

RBTNode * __thiscall Set::delete_min(Set *this,RBTNode *tree)

{
  bool bVar1;
  RBTNode *pRVar2;
  RBTNode *local_20;
  RBTNode *tree_local;
  Set *this_local;
  
  if (tree->left == (RBTNode *)0x0) {
    if (tree != (RBTNode *)0x0) {
      operator_delete(tree,0x20);
    }
    this_local = (Set *)0x0;
  }
  else {
    bVar1 = isred(this,tree->left);
    local_20 = tree;
    if (!bVar1) {
      bVar1 = isred(this,tree->left->left);
      if (!bVar1) {
        local_20 = move_red_left(this,tree);
      }
    }
    pRVar2 = delete_min(this,local_20->left);
    local_20->left = pRVar2;
    this_local = (Set *)fix_up(this,local_20);
  }
  return (RBTNode *)this_local;
}

Assistant:

RBTNode* Set::delete_min(RBTNode* tree) {
    /* 删除操作 */
    if (tree->left == NULL) {
        delete(tree);
        return NULL;
    }
    /* 若子结点和孙结点有不为黑的，就不能操作，否则有两个连续红色 */
    if (!isred(tree->left) && !isred(tree->left->left))
        tree = move_red_left(tree);
    /* 向下递归 */
    tree->left = delete_min(tree->left);
    /* 修正 */
    return fix_up(tree);
}